

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_io.c
# Opt level: O1

int kvtree_lseek(char *file,int fd,off_t pos,int whence)

{
  uint __errnum;
  __off_t _Var1;
  uint *puVar2;
  char *pcVar3;
  
  _Var1 = lseek(fd,pos,whence);
  if (_Var1 == -1) {
    puVar2 = (uint *)__errno_location();
    __errnum = *puVar2;
    pcVar3 = strerror(__errnum);
    kvtree_err("Error seeking %s: errno=%d %s @ %s:%d",file,(ulong)__errnum,pcVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
               ,0xfb);
  }
  return (uint)(_Var1 == -1);
}

Assistant:

int kvtree_lseek(const char* file, int fd, off_t pos, int whence)
{
  off_t rc = lseek(fd, pos, whence);
  if (rc == (off_t)-1) {
    kvtree_err("Error seeking %s: errno=%d %s @ %s:%d",
      file, errno, strerror(errno), __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }
  return KVTREE_SUCCESS;
}